

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall
smf::MidiMessage::makeTemperamentEqual(MidiMessage *this,int referencePitchClass,int channelMask)

{
  pointer pdVar1;
  vector<double,_std::allocator<double>_> local_38;
  
  pdVar1 = (pointer)operator_new(0x60);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 0xc;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  pdVar1[2] = 0.0;
  pdVar1[3] = 0.0;
  pdVar1[4] = 0.0;
  pdVar1[5] = 0.0;
  pdVar1[6] = 0.0;
  pdVar1[7] = 0.0;
  pdVar1[8] = 0.0;
  pdVar1[9] = 0.0;
  pdVar1[10] = 0.0;
  pdVar1[0xb] = 0.0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  makeMts9_TemperamentByCentsDeviationFromET(this,&local_38,referencePitchClass,channelMask);
  operator_delete(pdVar1);
  return;
}

Assistant:

void MidiMessage::makeTemperamentEqual(int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12, 0.0);
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}